

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.hpp
# Opt level: O1

void __thiscall
xercesc_4_0::MixedContentModel::checkUniqueParticleAttribution
          (MixedContentModel *this,SchemaGrammar *param_1,GrammarResolver *param_2,
          XMLStringPool *param_3,XMLValidator *param_4,uint *pContentSpecOrgURI,XMLCh *param_6)

{
  uint uVar1;
  ulong uVar2;
  QName **ppQVar3;
  ulong uVar4;
  
  uVar2 = this->fCount;
  if (uVar2 != 0) {
    ppQVar3 = this->fChildren;
    uVar4 = 0;
    do {
      uVar1 = ppQVar3[uVar4]->fURIId;
      if (((uVar1 != 0xfffffff1) && (uVar1 != 0xfffffffe)) && (uVar1 != 0xffffffff)) {
        ppQVar3[uVar4]->fURIId = pContentSpecOrgURI[uVar1];
      }
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < uVar2);
  }
  return;
}

Assistant:

inline void MixedContentModel::checkUniqueParticleAttribution
    (
        SchemaGrammar*    const
      , GrammarResolver*  const
      , XMLStringPool*    const
      , XMLValidator*     const
      , unsigned int*     const pContentSpecOrgURI
      , const XMLCh*            /*pComplexTypeName*/ /*= 0*/
    )
{
    // rename back
    unsigned int i = 0;
    for (i = 0; i < fCount; i++) {
        unsigned int orgURIIndex = fChildren[i]->getURI();
        if ((orgURIIndex != XMLContentModel::gEOCFakeId) &&
            (orgURIIndex != XMLElementDecl::fgInvalidElemId) &&
            (orgURIIndex != XMLElementDecl::fgPCDataElemId))
            fChildren[i]->setURI(pContentSpecOrgURI[orgURIIndex]);
    }

    // for mixed content model, it's only a sequence
    // UPA checking is not necessary
}